

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory_tests.cc
# Opt level: O0

void __thiscall
lf::mesh::hybrid2d::test::lf_hybrid2d_EdgeNumbering_Test::TestBody
          (lf_hybrid2d_EdgeNumbering_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  iterator iVar6;
  iterator iVar7;
  reference ppEVar8;
  undefined4 extraout_var_00;
  element_type *peVar9;
  undefined4 extraout_var_01;
  AssertHelper local_6c8;
  Message local_6c0;
  int local_6b4;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> local_6b0;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_6a0;
  uint local_694;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_19;
  Message local_678;
  int local_670;
  uint local_66c;
  undefined1 local_668 [8];
  AssertionResult gtest_ar_18;
  Message local_650;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_648;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_17;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_618;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  right_edge;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> entities1;
  Message local_5f8;
  int local_5f0;
  uint local_5ec;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar_16;
  Message local_5d0;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_5c8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_15;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_598;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  node3;
  Message local_588;
  int local_580;
  uint local_57c;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_14;
  Message local_560;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_558;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_13;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_528;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  node2;
  Message local_518;
  int local_510;
  uint local_50c;
  undefined1 local_508 [8];
  AssertionResult gtest_ar_12;
  Message local_4f0;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_4e8;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_11;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_4b8;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  node1;
  Message local_4a8;
  int local_4a0;
  uint local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_10;
  Message local_480;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_478;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_9;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_448;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  node0;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> entities2;
  undefined1 local_418 [8];
  VectorXd zero;
  Message local_400;
  int local_3f8;
  uint local_3f4;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_8;
  Message local_3d8;
  int local_3d0;
  uint local_3cc;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_7;
  Message local_3b0;
  int local_3a8;
  uint local_3a4;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_6;
  shared_ptr<lf::mesh::Mesh> mesh;
  Message local_378;
  undefined1 local_370 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_368;
  array<unsigned_int,_2UL> local_360;
  span<const_unsigned_int,_18446744073709551615UL> local_358;
  RefEl local_341;
  size_type local_340 [2];
  undefined1 local_338 [8];
  AssertionResult gtest_ar_5;
  Scalar local_320;
  Scalar local_318;
  Scalar local_310;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_308;
  int local_2e8 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_2e0;
  AssertHelper local_2c8;
  Message local_2c0;
  undefined1 local_2b8 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_2b0;
  array<unsigned_int,_4UL> local_2a8;
  span<const_unsigned_int,_18446744073709551615UL> local_298;
  RefEl local_281;
  size_type local_280 [2];
  undefined1 local_278 [8];
  AssertionResult gtest_ar_4;
  Scalar local_260;
  Scalar local_258;
  Scalar local_250;
  Scalar local_248;
  Scalar local_240;
  Scalar local_238;
  Scalar local_230;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_228;
  int local_208 [2];
  undefined1 local_200 [8];
  MatrixXd node_coord;
  Message local_1e0;
  int local_1d4 [3];
  Matrix<double,2,1,0,2,1> local_1c8 [24];
  coord_t local_1b0;
  size_type local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_3;
  Message local_180;
  int local_174 [3];
  Matrix<double,2,1,0,2,1> local_168 [24];
  coord_t local_150;
  size_type local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  Message local_120;
  int local_114 [3];
  Matrix<double,2,1,0,2,1> local_108 [16];
  coord_t local_f8;
  size_type local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  Message local_c8;
  int local_c0 [4];
  int local_b0 [2];
  Matrix<double,2,1,0,2,1> local_a8 [16];
  coord_t local_98;
  size_type local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  MeshFactory mf;
  lf_hybrid2d_EdgeNumbering_Test *this_local;
  
  MeshFactory::MeshFactory((MeshFactory *)&gtest_ar.message_,2,true);
  local_b0[1] = 0;
  local_b0[0] = 0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_a8,local_b0 + 1,local_b0);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_98,
             (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_a8);
  local_84 = MeshFactory::AddPoint((MeshFactory *)&gtest_ar.message_,&local_98);
  local_c0[0] = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_80,"mf.AddPoint(Eigen::Vector2d(0, 0))","0",&local_84,local_c0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x58,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_114[2] = 1;
  local_114[1] = 0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_108,local_114 + 2,local_114 + 1);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_f8,
             (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_108);
  local_e4 = MeshFactory::AddPoint((MeshFactory *)&gtest_ar.message_,&local_f8);
  local_114[0] = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_e0,"mf.AddPoint(Eigen::Vector2d(1, 0))","1",&local_e4,local_114);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_174[2] = 1;
  local_174[1] = 1;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_168,local_174 + 2,local_174 + 1);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_150,
             (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_168);
  local_13c = MeshFactory::AddPoint((MeshFactory *)&gtest_ar.message_,&local_150);
  local_174[0] = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_138,"mf.AddPoint(Eigen::Vector2d(1, 1))","2",&local_13c,local_174);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_1d4[2] = 0;
  local_1d4[1] = 1;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_1c8,local_1d4 + 2,local_1d4 + 1);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_1b0,
             (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_1c8);
  local_19c = MeshFactory::AddPoint((MeshFactory *)&gtest_ar.message_,&local_1b0);
  local_1d4[0] = 3;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_198,"mf.AddPoint(Eigen::Vector2d(0, 1))","3",&local_19c,local_1d4);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &node_coord.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &node_coord.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &node_coord.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_208[1] = 2;
  local_208[0] = 4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_200,local_208 + 1,local_208);
  local_230 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_228,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_200,&local_230
            );
  local_238 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_228,&local_238);
  local_240 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_240);
  local_248 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_248);
  local_250 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_250);
  local_258 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_258);
  local_260 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_260);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3ff0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar4,(Scalar *)&gtest_ar_4.message_);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_228);
  local_280[1] = 0;
  local_281 = lf::base::RefEl::kQuad();
  local_2a8._M_elems[0] = 0;
  local_2a8._M_elems[1] = 1;
  local_2a8._M_elems[2] = 2;
  local_2a8._M_elems[3] = 3;
  std::span<const_unsigned_int,_18446744073709551615UL>::span<unsigned_int,_4UL>
            (&local_298,&local_2a8);
  std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_2b8);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::QuadO1,std::default_delete<lf::geometry::QuadO1>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_2b0,
             (unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_> *)
             local_2b8);
  local_280[0] = MeshFactory::AddEntity
                           ((MeshFactory *)&gtest_ar.message_,local_281,&local_298,&local_2b0);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_278,"0",
             "mf.AddEntity( base::RefEl::kQuad(), std::array<size_type, 4>{{0, 1, 2, 3}}, std::make_unique<geometry::QuadO1>(std::move(node_coord)))"
             ,(int *)(local_280 + 1),local_280);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_2b0);
  std::unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>::~unique_ptr
            ((unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_> *)
             local_2b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  local_2e8[1] = 2;
  local_2e8[0] = 2;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_2e0,local_2e8 + 1,local_2e8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_200,&local_2e0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2e0);
  local_310 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_308,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_200,&local_310
            );
  local_318 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_308,&local_318);
  local_320 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_320);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3ff0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar4,(Scalar *)&gtest_ar_5.message_);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_308);
  local_340[1] = 0;
  local_341 = lf::base::RefEl::kSegment();
  local_360._M_elems[0] = 1;
  local_360._M_elems[1] = 2;
  std::span<const_unsigned_int,_18446744073709551615UL>::span<unsigned_int,_2UL>
            (&local_358,&local_360);
  std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_370);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::SegmentO1,std::default_delete<lf::geometry::SegmentO1>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_368,
             (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_> *)
             local_370);
  local_340[0] = MeshFactory::AddEntity
                           ((MeshFactory *)&gtest_ar.message_,local_341,&local_358,&local_368);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_338,"0",
             "mf.AddEntity(base::RefEl::kSegment(), std::array<size_type, 2>{{1, 2}}, std::make_unique<geometry::SegmentO1>(node_coord))"
             ,(int *)(local_340 + 1),local_340);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_368);
  std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
  ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_> *)
              local_370);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_378);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  MeshFactory::Build((MeshFactory *)&gtest_ar_6.message_);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_6.message_);
  local_3a4 = (*peVar5->_vptr_Mesh[3])(peVar5,0);
  local_3a8 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_3a0,"mesh->NumEntities(0)","1",&local_3a4,&local_3a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_6.message_);
  local_3cc = (*peVar5->_vptr_Mesh[3])(peVar5,1);
  local_3d0 = 4;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_3c8,"mesh->NumEntities(1)","4",&local_3cc,&local_3d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_6.message_);
  local_3f4 = (*peVar5->_vptr_Mesh[3])(peVar5,2);
  local_3f8 = 4;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_3f0,"mesh->NumEntities(2)","4",&local_3f4,&local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &zero.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &zero.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               ,&local_400);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &zero.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              );
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&entities2._M_extent,0);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_418,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&entities2._M_extent);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_6.message_);
  iVar2 = (*peVar5->_vptr_Mesh[2])(peVar5,2);
  node0._M_current = (Entity **)CONCAT44(extraout_var,iVar2);
  iVar6 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&node0);
  iVar7 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&node0);
  gtest_ar_9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_418;
  local_448 = std::
              find_if<__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>,lf::mesh::hybrid2d::test::lf_hybrid2d_EdgeNumbering_Test::TestBody()::__0>
                        (iVar6._M_current,iVar7._M_current,
                         (anon_class_8_1_8994aba6_for__M_pred)
                         gtest_ar_9.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  local_478._M_current =
       (Entity **)
       std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                 ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&node0);
  testing::internal::
  CmpHelperNE<__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>,__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>>
            ((internal *)local_470,"node0","entities2.end()",&local_448,&local_478);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_6.message_);
  ppEVar8 = __gnu_cxx::
            __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
            ::operator*(&local_448);
  local_49c = (*peVar5->_vptr_Mesh[5])(peVar5,*ppEVar8);
  local_4a0 = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_498,"mesh->Index(**node0)","0",&local_49c,&local_4a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&node1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x79,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&node1,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&node1);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  iVar6 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&node0);
  iVar7 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&node0);
  gtest_ar_11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_418;
  local_4b8 = std::
              find_if<__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>,lf::mesh::hybrid2d::test::lf_hybrid2d_EdgeNumbering_Test::TestBody()::__1>
                        (iVar6._M_current,iVar7._M_current,
                         (anon_class_8_1_8994aba6_for__M_pred)
                         gtest_ar_11.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  local_4e8._M_current =
       (Entity **)
       std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                 ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&node0);
  testing::internal::
  CmpHelperNE<__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>,__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>>
            ((internal *)local_4e0,"node1","entities2.end()",&local_4b8,&local_4e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x7e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_6.message_);
  ppEVar8 = __gnu_cxx::
            __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
            ::operator*(&local_4b8);
  local_50c = (*peVar5->_vptr_Mesh[5])(peVar5,*ppEVar8);
  local_510 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_508,"mesh->Index(**node1)","1",&local_50c,&local_510);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&node2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x7f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&node2,&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&node2);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  iVar6 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&node0);
  iVar7 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&node0);
  gtest_ar_13.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_418;
  local_528 = std::
              find_if<__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>,lf::mesh::hybrid2d::test::lf_hybrid2d_EdgeNumbering_Test::TestBody()::__2>
                        (iVar6._M_current,iVar7._M_current,
                         (anon_class_8_1_8994aba6_for__M_pred)
                         gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  local_558._M_current =
       (Entity **)
       std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                 ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&node0);
  testing::internal::
  CmpHelperNE<__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>,__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>>
            ((internal *)local_550,"node2","entities2.end()",&local_528,&local_558);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar1) {
    testing::Message::Message(&local_560);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_560);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_6.message_);
  ppEVar8 = __gnu_cxx::
            __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
            ::operator*(&local_528);
  local_57c = (*peVar5->_vptr_Mesh[5])(peVar5,*ppEVar8);
  local_580 = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_578,"mesh->Index(**node2)","2",&local_57c,&local_580);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar1) {
    testing::Message::Message(&local_588);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&node3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&node3,&local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&node3);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  iVar6 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&node0);
  iVar7 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&node0);
  gtest_ar_15.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_418;
  local_598 = std::
              find_if<__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>,lf::mesh::hybrid2d::test::lf_hybrid2d_EdgeNumbering_Test::TestBody()::__3>
                        (iVar6._M_current,iVar7._M_current,
                         (anon_class_8_1_8994aba6_for__M_pred)
                         gtest_ar_15.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  local_5c8._M_current =
       (Entity **)
       std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                 ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&node0);
  testing::internal::
  CmpHelperNE<__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>,__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>>
            ((internal *)local_5c0,"node3","entities2.end()",&local_598,&local_5c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar1) {
    testing::Message::Message(&local_5d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x8a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_5d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_5d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_6.message_);
  ppEVar8 = __gnu_cxx::
            __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
            ::operator*(&local_598);
  local_5ec = (*peVar5->_vptr_Mesh[5])(peVar5,*ppEVar8);
  local_5f0 = 3;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_5e8,"mesh->Index(**node3)","3",&local_5ec,&local_5f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&entities1._M_extent,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x8b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&entities1._M_extent,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&entities1._M_extent);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_6.message_);
  iVar2 = (*peVar5->_vptr_Mesh[2])(peVar5,1);
  right_edge._M_current = (Entity **)CONCAT44(extraout_var_00,iVar2);
  iVar6 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&right_edge);
  iVar7 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&right_edge);
  local_618 = std::
              find_if<__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>,lf::mesh::hybrid2d::test::lf_hybrid2d_EdgeNumbering_Test::TestBody()::__4>
                        (iVar6._M_current,iVar7._M_current);
  local_648._M_current =
       (Entity **)
       std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                 ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&right_edge);
  testing::internal::
  CmpHelperNE<__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>,__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>>
            ((internal *)local_640,"right_edge","entities1.end()",&local_618,&local_648);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_6.message_);
  ppEVar8 = __gnu_cxx::
            __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
            ::operator*(&local_618);
  local_66c = (*peVar5->_vptr_Mesh[5])(peVar5,*ppEVar8);
  local_670 = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_668,"mesh->Index(**right_edge)","0",&local_66c,&local_670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
  if (!bVar1) {
    testing::Message::Message(&local_678);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_668);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_678);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_6.message_);
  peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_6.message_);
  iVar2 = (*peVar9->_vptr_Mesh[2])(peVar9,0);
  local_6b0._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar2);
  local_6a0._M_current =
       (Entity **)
       std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin(&local_6b0);
  ppEVar8 = __gnu_cxx::
            __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
            ::operator*(&local_6a0);
  local_694 = (*peVar5->_vptr_Mesh[5])(peVar5,*ppEVar8);
  local_6b4 = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_690,"mesh->Index(**mesh->Entities(0).begin())","0",&local_694,
             &local_6b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
  if (!bVar1) {
    testing::Message::Message(&local_6c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_690);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6c8,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper(&local_6c8);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_418);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)&gtest_ar_6.message_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_200);
  MeshFactory::~MeshFactory((MeshFactory *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(lf_hybrid2d, EdgeNumbering) {
  // Construct a one element mesh that consists of a quad:
  MeshFactory mf(2);

  // add nodes
  EXPECT_EQ(mf.AddPoint(Eigen::Vector2d(0, 0)), 0);
  EXPECT_EQ(mf.AddPoint(Eigen::Vector2d(1, 0)), 1);
  EXPECT_EQ(mf.AddPoint(Eigen::Vector2d(1, 1)), 2);
  EXPECT_EQ(mf.AddPoint(Eigen::Vector2d(0, 1)), 3);

  // add an element
  Eigen::MatrixXd node_coord(2, 4);
  node_coord << 0, 1, 1, 0, 0, 0, 1, 1;
  EXPECT_EQ(0, mf.AddEntity(
                   base::RefEl::kQuad(), std::array<size_type, 4>{{0, 1, 2, 3}},
                   std::make_unique<geometry::QuadO1>(std::move(node_coord))));

  // explicitly add the right edge:
  node_coord = Eigen::MatrixXd(2, 2);
  node_coord << 1, 1, 0, 1;
  EXPECT_EQ(
      0, mf.AddEntity(base::RefEl::kSegment(), std::array<size_type, 2>{{1, 2}},
                      std::make_unique<geometry::SegmentO1>(node_coord)));

  // build the mesh
  auto mesh = mf.Build();

  EXPECT_EQ(mesh->NumEntities(0), 1);
  EXPECT_EQ(mesh->NumEntities(1), 4);
  EXPECT_EQ(mesh->NumEntities(2), 4);

  // check indices of the nodes:
  Eigen::VectorXd zero = Eigen::VectorXd::Zero(0);
  auto entities2 = mesh->Entities(2);
  auto node0 = std::find_if(entities2.begin(), entities2.end(), [&](auto e) {
    return e->Geometry()->Global(zero).norm() < 1e-6;
  });
  EXPECT_NE(node0, entities2.end());
  EXPECT_EQ(mesh->Index(**node0), 0);

  auto node1 = std::find_if(entities2.begin(), entities2.end(), [&](auto& e) {
    return e->Geometry()->Global(zero).isApprox(Eigen::Vector2d(1, 0));
  });
  EXPECT_NE(node1, entities2.end());
  EXPECT_EQ(mesh->Index(**node1), 1);

  auto node2 = std::find_if(entities2.begin(), entities2.end(), [&](auto& e) {
    return e->Geometry()->Global(zero).isApprox(Eigen::Vector2d(1, 1));
  });
  EXPECT_NE(node2, entities2.end());
  EXPECT_EQ(mesh->Index(**node2), 2);

  auto node3 = std::find_if(entities2.begin(), entities2.end(), [&](auto& e) {
    return e->Geometry()->Global(zero).isApprox(Eigen::Vector2d(0, 1));
  });
  EXPECT_NE(node3, entities2.end());
  EXPECT_EQ(mesh->Index(**node3), 3);

  // check index of right edge:
  auto entities1 = mesh->Entities(1);
  auto right_edge =
      std::find_if(entities1.begin(), entities1.end(), [](auto& e) {
        return e->Geometry()
            ->Global(Eigen::VectorXd::Constant(1, 0.5))
            .isApprox(Eigen::Vector2d(1, 0.5));
      });
  EXPECT_NE(right_edge, entities1.end());
  EXPECT_EQ(mesh->Index(**right_edge), 0);

  // check index of element:
  EXPECT_EQ(mesh->Index(**mesh->Entities(0).begin()), 0);
}